

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionParser::Parse
          (cmGeneratorExpressionParser *this,
          vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
          *result)

{
  bool bVar1;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_28;
  cmGeneratorExpressionToken *local_20;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *local_18;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *result_local;
  cmGeneratorExpressionParser *this_local;
  
  local_18 = result;
  result_local = (vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  *)this;
  local_20 = (cmGeneratorExpressionToken *)
             std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
             begin(&this->Tokens);
  (this->it)._M_current = local_20;
  while( true ) {
    local_28._M_current =
         (cmGeneratorExpressionToken *)
         std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                   (&this->Tokens);
    bVar1 = __gnu_cxx::operator!=(&this->it,&local_28);
    if (!bVar1) break;
    ParseContent(this,local_18);
  }
  return;
}

Assistant:

void cmGeneratorExpressionParser::Parse(
  std::vector<cmGeneratorExpressionEvaluator*>& result)
{
  it = this->Tokens.begin();

  while (this->it != this->Tokens.end()) {
    this->ParseContent(result);
  }
}